

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall wabt::SharedValidator::OnThrow(SharedValidator *this,Location *loc,Var *event_var)

{
  Result rhs;
  Var local_90;
  Enum local_44;
  undefined1 local_40 [8];
  EventType event_type;
  Var *event_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  event_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)event_var;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  this->expr_loc_ = loc;
  EventType::EventType((EventType *)local_40);
  Var::Var(&local_90,event_var);
  local_44 = (Enum)CheckEventIndex(this,&local_90,(EventType *)local_40);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_44);
  Var::~Var(&local_90);
  rhs = TypeChecker::OnThrow(&this->typechecker_,(TypeVector *)local_40);
  Result::operator|=((Result *)((long)&this_local + 4),rhs);
  EventType::~EventType((EventType *)local_40);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnThrow(const Location& loc, Var event_var) {
  Result result = Result::Ok;
  expr_loc_ = &loc;
  EventType event_type;
  result |= CheckEventIndex(event_var, &event_type);
  result |= typechecker_.OnThrow(event_type.params);
  return result;
}